

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O0

batch __thiscall
ear::PolarExtentCoreSimd<xsimd::sse4_2>::weight_from_sin
          (PolarExtentCoreSimd<xsimd::sse4_2> *this,PolarExtentCoreContext *ctx,batch sin_angle)

{
  bool bVar1;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  float in_XMM0_Dd;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  float extraout_XMM0_Dd_03;
  float extraout_XMM0_Dd_04;
  undefined8 uVar2;
  batch_bool<float,_xsimd::sse4_2> bVar3;
  batch<float,_xsimd::sse4_2> bVar4;
  batch bVar5;
  batch<float,_xsimd::sse4_2> local_f8;
  batch<float,_xsimd::sse4_2> local_e8;
  batch<float,_xsimd::sse4_2> local_d8;
  batch<float,_xsimd::sse4_2> local_c8;
  simd_register<float,_xsimd::sse3> local_b8;
  batch<float,_xsimd::sse4_2> local_a8;
  simd_register<float,_xsimd::sse3> local_98;
  undefined1 auStack_88 [8];
  batch<float,_xsimd::sse4_2> ramp;
  undefined1 auStack_68 [8];
  batch_bool<float,_xsimd::sse4_2> end;
  undefined1 auStack_48 [8];
  batch_bool<float,_xsimd::sse4_2> start;
  PolarExtentCoreContext *ctx_local;
  PolarExtentCoreSimd<xsimd::sse4_2> *this_local;
  batch sin_angle_local;
  
  unique0x100000a9 = (float)in_XMM0_Dc;
  this_local._0_4_ =
       (float)(int)sin_angle.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  this_local._4_4_ =
       (float)(int)((ulong)sin_angle.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  unique0x100000ad = in_XMM0_Dd;
  start.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
  super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
  super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data._8_8_ = ctx;
  xsimd::batch<float,_xsimd::sse4_2>::batch
            ((batch<float,_xsimd::sse4_2> *)
             ((long)end.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                    super_simd_register<float,_xsimd::sse4_1>.
                    super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>
                    .super_simd_register<float,_xsimd::sse2>.data + 8),ctx->sin_start_angle);
  bVar3 = xsimd::operator<=((batch<float,_xsimd::sse4_2> *)&this_local,
                            (batch<float,_xsimd::sse4_2> *)
                            ((long)end.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                                   super_simd_register<float,_xsimd::sse4_1>.
                                   super_simd_register<float,_xsimd::ssse3>.
                                   super_simd_register<float,_xsimd::sse3>.
                                   super_simd_register<float,_xsimd::sse2>.data + 8));
  unique0x100000cd = (float)extraout_XMM0_Dc;
  auStack_48._0_4_ =
       (float)(int)bVar3.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  auStack_48._4_4_ =
       (float)(int)((ulong)bVar3.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  unique0x100000d1 = extraout_XMM0_Dd;
  xsimd::batch<float,_xsimd::sse4_2>::batch
            ((batch<float,_xsimd::sse4_2> *)
             ((long)ramp.super_simd_register<float,_xsimd::sse4_2>.
                    super_simd_register<float,_xsimd::sse4_1>.
                    super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>
                    .super_simd_register<float,_xsimd::sse2>.data + 8),
             *(float *)(start.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                        super_simd_register<float,_xsimd::sse4_1>.
                        super_simd_register<float,_xsimd::ssse3>.
                        super_simd_register<float,_xsimd::sse3>.
                        super_simd_register<float,_xsimd::sse2>.data._8_8_ + 0x84));
  bVar3 = xsimd::operator>=((batch<float,_xsimd::sse4_2> *)&this_local,
                            (batch<float,_xsimd::sse4_2> *)
                            ((long)ramp.super_simd_register<float,_xsimd::sse4_2>.
                                   super_simd_register<float,_xsimd::sse4_1>.
                                   super_simd_register<float,_xsimd::ssse3>.
                                   super_simd_register<float,_xsimd::sse3>.
                                   super_simd_register<float,_xsimd::sse2>.data + 8));
  uVar2 = bVar3.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
          super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
          super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data._8_8_
  ;
  unique0x100000f1 = (float)extraout_XMM0_Dc_00;
  auStack_68._0_4_ =
       (float)(int)bVar3.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  auStack_68._4_4_ =
       (float)(int)((ulong)bVar3.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  unique0x100000f5 = extraout_XMM0_Dd_00;
  bVar1 = xsimd::all<float,xsimd::sse4_2>((batch_bool<float,_xsimd::sse4_2> *)auStack_48);
  if (bVar1) {
    xsimd::batch<float,_xsimd::sse4_2>::batch
              ((batch<float,_xsimd::sse4_2> *)
               ((long)sin_angle_local.super_simd_register<float,_xsimd::sse4_2>.
                      super_simd_register<float,_xsimd::sse4_1>.
                      super_simd_register<float,_xsimd::ssse3>.
                      super_simd_register<float,_xsimd::sse3>.
                      super_simd_register<float,_xsimd::sse2>.data + 8),1.0);
  }
  else {
    bVar1 = xsimd::all<float,xsimd::sse4_2>((batch_bool<float,_xsimd::sse4_2> *)auStack_68);
    if (bVar1) {
      xsimd::batch<float,_xsimd::sse4_2>::batch
                ((batch<float,_xsimd::sse4_2> *)
                 ((long)sin_angle_local.super_simd_register<float,_xsimd::sse4_2>.
                        super_simd_register<float,_xsimd::sse4_1>.
                        super_simd_register<float,_xsimd::ssse3>.
                        super_simd_register<float,_xsimd::sse3>.
                        super_simd_register<float,_xsimd::sse2>.data + 8),0.0);
    }
    else {
      xsimd::batch<float,_xsimd::sse4_2>::batch
                (&local_a8,
                 *(float *)(start.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                            super_simd_register<float,_xsimd::sse4_1>.
                            super_simd_register<float,_xsimd::ssse3>.
                            super_simd_register<float,_xsimd::sse3>.
                            super_simd_register<float,_xsimd::sse2>.data._8_8_ + 0x88));
      bVar4 = xsimd::asin<float,xsimd::sse4_2>((batch<float,_xsimd::sse4_2> *)&this_local);
      local_b8.super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_01;
      local_b8.super_simd_register<float,_xsimd::sse2>.data[0] =
           (float)(int)bVar4.super_simd_register<float,_xsimd::sse4_2>.
                       super_simd_register<float,_xsimd::sse4_1>.
                       super_simd_register<float,_xsimd::ssse3>.
                       super_simd_register<float,_xsimd::sse3>.
                       super_simd_register<float,_xsimd::sse2>.data._0_8_;
      local_b8.super_simd_register<float,_xsimd::sse2>.data[1] =
           (float)(int)((ulong)bVar4.super_simd_register<float,_xsimd::sse4_2>.
                               super_simd_register<float,_xsimd::sse4_1>.
                               super_simd_register<float,_xsimd::ssse3>.
                               super_simd_register<float,_xsimd::sse3>.
                               super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
      local_b8.super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_01;
      bVar4 = xsimd::operator*(&local_a8,(batch<float,_xsimd::sse4_2> *)&local_b8);
      local_98.super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_02;
      local_98.super_simd_register<float,_xsimd::sse2>.data[0] =
           (float)(int)bVar4.super_simd_register<float,_xsimd::sse4_2>.
                       super_simd_register<float,_xsimd::sse4_1>.
                       super_simd_register<float,_xsimd::ssse3>.
                       super_simd_register<float,_xsimd::sse3>.
                       super_simd_register<float,_xsimd::sse2>.data._0_8_;
      local_98.super_simd_register<float,_xsimd::sse2>.data[1] =
           (float)(int)((ulong)bVar4.super_simd_register<float,_xsimd::sse4_2>.
                               super_simd_register<float,_xsimd::sse4_1>.
                               super_simd_register<float,_xsimd::ssse3>.
                               super_simd_register<float,_xsimd::sse3>.
                               super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
      local_98.super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_02;
      xsimd::batch<float,_xsimd::sse4_2>::batch
                (&local_c8,
                 *(float *)(start.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                            super_simd_register<float,_xsimd::sse4_1>.
                            super_simd_register<float,_xsimd::ssse3>.
                            super_simd_register<float,_xsimd::sse3>.
                            super_simd_register<float,_xsimd::sse2>.data._8_8_ + 0x8c));
      bVar4 = xsimd::operator+((batch<float,_xsimd::sse4_2> *)&local_98,&local_c8);
      unique0x1000015d = (float)extraout_XMM0_Dc_03;
      auStack_88._0_4_ =
           (float)(int)bVar4.super_simd_register<float,_xsimd::sse4_2>.
                       super_simd_register<float,_xsimd::sse4_1>.
                       super_simd_register<float,_xsimd::ssse3>.
                       super_simd_register<float,_xsimd::sse3>.
                       super_simd_register<float,_xsimd::sse2>.data._0_8_;
      auStack_88._4_4_ =
           (float)(int)((ulong)bVar4.super_simd_register<float,_xsimd::sse4_2>.
                               super_simd_register<float,_xsimd::sse4_1>.
                               super_simd_register<float,_xsimd::ssse3>.
                               super_simd_register<float,_xsimd::sse3>.
                               super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
      unique0x10000161 = extraout_XMM0_Dd_03;
      xsimd::batch<float,_xsimd::sse4_2>::batch(&local_d8,1.0);
      xsimd::batch<float,_xsimd::sse4_2>::batch(&local_f8,0.0);
      bVar4 = xsimd::select<float,xsimd::sse4_2>
                        ((batch_bool<float,_xsimd::sse4_2> *)auStack_68,&local_f8,
                         (batch<float,_xsimd::sse4_2> *)auStack_88);
      local_e8.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
      super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
      super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_04;
      local_e8.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
      super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
      super_simd_register<float,_xsimd::sse2>.data[0] =
           (float)(int)bVar4.super_simd_register<float,_xsimd::sse4_2>.
                       super_simd_register<float,_xsimd::sse4_1>.
                       super_simd_register<float,_xsimd::ssse3>.
                       super_simd_register<float,_xsimd::sse3>.
                       super_simd_register<float,_xsimd::sse2>.data._0_8_;
      local_e8.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
      super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
      super_simd_register<float,_xsimd::sse2>.data[1] =
           (float)(int)((ulong)bVar4.super_simd_register<float,_xsimd::sse4_2>.
                               super_simd_register<float,_xsimd::sse4_1>.
                               super_simd_register<float,_xsimd::ssse3>.
                               super_simd_register<float,_xsimd::sse3>.
                               super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
      local_e8.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
      super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
      super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_04;
      bVar4 = xsimd::select<float,xsimd::sse4_2>
                        ((batch_bool<float,_xsimd::sse4_2> *)auStack_48,&local_d8,&local_e8);
      uVar2 = bVar4.super_simd_register<float,_xsimd::sse4_2>.
              super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
              super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data.
              _8_8_;
      sin_angle_local.super_simd_register<float,_xsimd::sse4_2>.
      super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
      super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data._8_8_ =
           bVar4.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>
           .super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
           super_simd_register<float,_xsimd::sse2>.data._0_8_;
    }
  }
  bVar5.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[2] = (float)(int)uVar2;
  bVar5.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[3] = (float)(int)((ulong)uVar2 >> 0x20);
  bVar5.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] =
       sin_angle_local.super_simd_register<float,_xsimd::sse4_2>.
       super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
       super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[2];
  bVar5.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] =
       sin_angle_local.super_simd_register<float,_xsimd::sse4_2>.
       super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
       super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[3];
  return (batch)bVar5.super_simd_register<float,_xsimd::sse4_2>.
                super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
                super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data
  ;
}

Assistant:

batch weight_from_sin(PolarExtentCoreContext &ctx, batch sin_angle) const {
      auto start = sin_angle <= ctx.sin_start_angle;
      auto end = sin_angle >= ctx.sin_end_angle;
      if (xsimd::all(start)) return batch{1.0};
      if (xsimd::all(end)) return batch{0.0};

      auto ramp = ctx.m * xsimd::asin(sin_angle) + ctx.c;
      return xsimd::select(start, batch{1.0},
                           xsimd::select(end, batch{0.0}, ramp));
    }